

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile
          (TiledRgbaInputFile *this,IStream *is,string *layerName,int numThreads)

{
  ContextInitializer *this_00;
  undefined8 in_RDI;
  undefined1 onoff;
  undefined1 local_98 [16];
  IStream *in_stack_ffffffffffffff78;
  ContextInitializer *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  ContextInitializer *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  TiledRgbaInputFile *in_stack_ffffffffffffffc0;
  
  onoff = (undefined1)((ulong)in_RDI >> 0x38);
  this_00 = (ContextInitializer *)IStream::fileName((IStream *)0x24d7bf);
  memset(local_98,0,0x78);
  ContextInitializer::ContextInitializer((ContextInitializer *)local_98);
  ContextInitializer::silentHeaderParse(this_00,(bool)onoff);
  ContextInitializer::strictHeaderValidation(this_00,(bool)onoff);
  ContextInitializer::setInputStream(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  TiledRgbaInputFile(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is,
    const string&                            layerName,
    int                                      numThreads)
    : TiledRgbaInputFile (
        is.fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (&is),
        layerName,
        numThreads)
{
}